

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

ecdh_key * ssh_ntru_new(ssh_kex *kex,_Bool is_server)

{
  _Bool is_server_local;
  ssh_kex *kex_local;
  
  if (is_server) {
    kex_local = (ssh_kex *)ssh_ntru_server_new();
  }
  else {
    kex_local = (ssh_kex *)ssh_ntru_client_new();
  }
  return (ecdh_key *)kex_local;
}

Assistant:

static ecdh_key *ssh_ntru_new(const ssh_kex *kex, bool is_server)
{
    if (is_server)
        return ssh_ntru_server_new();
    else
        return ssh_ntru_client_new();
}